

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

CapabilityPipe * kj::newCapabilityPipe(void)

{
  RefOrVoid<kj::(anonymous_namespace)::AsyncPipe> pAVar1;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *params;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *params_1;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> *pOVar2;
  Own<kj::AsyncCapabilityStream,decltype(nullptr)> *in_RDI;
  undefined1 local_80 [8];
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> end2;
  undefined1 local_60 [24];
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> end1;
  undefined1 local_30 [8];
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> pipe2;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> pipe1;
  
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  pAVar1 = Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&pipe2.ptr);
  addRef<kj::(anonymous_namespace)::AsyncPipe>((kj *)local_60,pAVar1);
  pAVar1 = Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_30);
  addRef<kj::(anonymous_namespace)::AsyncPipe>((kj *)&end2.ptr,pAVar1);
  heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
            ((kj *)(local_60 + 0x10),
             (Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_60,
             (Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&end2.ptr);
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&end2.ptr);
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_60);
  params = mv<kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_30);
  params_1 = mv<kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                       ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&pipe2.ptr);
  heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
            ((kj *)local_80,params,params_1);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::TwoWayPipeEnd,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> *)
                      (local_60 + 0x10));
  Own<kj::AsyncCapabilityStream,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,void>(in_RDI,pOVar2);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::TwoWayPipeEnd,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> *)local_80);
  Own<kj::AsyncCapabilityStream,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,void>(in_RDI + 0x10,pOVar2);
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> *)local_80);
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> *)(local_60 + 0x10));
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)local_30);
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> *)&pipe2.ptr);
  return (CapabilityPipe *)in_RDI;
}

Assistant:

CapabilityPipe newCapabilityPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}